

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigWnd.c
# Opt level: O2

void Saig_ManWindowCreatePos(Aig_Man_t *pNew,Aig_Man_t *p0,Aig_Man_t *p1)

{
  int iVar1;
  uint uVar2;
  Aig_Obj_t *pAVar3;
  ulong uVar4;
  Aig_Obj_t *pDriver;
  uint uVar5;
  ulong uVar6;
  int iVar7;
  Aig_Obj_t *pAVar8;
  int iVar9;
  int i;
  
  i = 0;
  do {
    if (p0->vObjs->nSize <= i) {
      return;
    }
    pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(p0->vObjs,i);
    if (((pAVar3 != (Aig_Obj_t *)0x0) && (pAVar3->TravId != p0->nTravIds)) &&
       (iVar1 = Aig_ObjIsConst1(pAVar3), iVar1 == 0)) {
      uVar2 = (uint)*(undefined8 *)&pAVar3->field_0x18;
      uVar5 = uVar2 & 7;
      if (uVar5 != 2) {
        if (p0->pReprs == (Aig_Obj_t **)0x0) {
          pAVar8 = (Aig_Obj_t *)0x0;
        }
        else {
          pAVar8 = p0->pReprs[pAVar3->Id];
        }
        if ((p1->pReprs == (Aig_Obj_t **)0x0) || (pAVar3 != p1->pReprs[pAVar8->Id])) {
          __assert_fail("pObj0 == Aig_ObjRepr( p1, pObj1 )",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saigWnd.c"
                        ,0x298,"void Saig_ManWindowCreatePos(Aig_Man_t *, Aig_Man_t *, Aig_Man_t *)"
                       );
        }
        if (uVar5 == 3) {
          uVar4 = (ulong)pAVar3->pFanin0 & 0xfffffffffffffffe;
          uVar6 = (ulong)pAVar8->pFanin0 & 0xfffffffffffffffe;
          if ((*(int *)(uVar6 + 0x20) != p1->nTravIds) == (*(int *)(uVar4 + 0x20) == p0->nTravIds))
          {
            __assert_fail("Aig_ObjIsTravIdCurrent(p0, pFanin0) == Aig_ObjIsTravIdCurrent(p1, pFanin1)"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saigWnd.c"
                          ,0x29e,
                          "void Saig_ManWindowCreatePos(Aig_Man_t *, Aig_Man_t *, Aig_Man_t *)");
          }
          if (*(int *)(uVar4 + 0x20) == p0->nTravIds) {
LAB_005a62e6:
            pAVar3 = Aig_Exor(pNew,*(Aig_Obj_t **)(uVar4 + 0x28),*(Aig_Obj_t **)(uVar6 + 0x28));
            Aig_ObjCreateCo(pNew,pAVar3);
          }
        }
        else {
          if ((uVar2 & 7) - 7 < 0xfffffffe) {
            __assert_fail("Aig_ObjIsNode(pObj0)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saigWnd.c"
                          ,0x2a7,
                          "void Saig_ManWindowCreatePos(Aig_Man_t *, Aig_Man_t *, Aig_Man_t *)");
          }
          uVar4 = (ulong)pAVar3->pFanin0 & 0xfffffffffffffffe;
          uVar6 = (ulong)pAVar8->pFanin0 & 0xfffffffffffffffe;
          iVar1 = *(int *)(uVar4 + 0x20);
          iVar7 = p0->nTravIds;
          iVar9 = p1->nTravIds;
          if ((*(int *)(uVar6 + 0x20) != iVar9) == (iVar1 == iVar7)) {
            __assert_fail("Aig_ObjIsTravIdCurrent(p0, pFanin0) == Aig_ObjIsTravIdCurrent(p1, pFanin1)"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saigWnd.c"
                          ,0x2ac,
                          "void Saig_ManWindowCreatePos(Aig_Man_t *, Aig_Man_t *, Aig_Man_t *)");
          }
          if (iVar1 == iVar7) {
            pDriver = Aig_Exor(pNew,*(Aig_Obj_t **)(uVar4 + 0x28),*(Aig_Obj_t **)(uVar6 + 0x28));
            Aig_ObjCreateCo(pNew,pDriver);
            iVar7 = p0->nTravIds;
            iVar9 = p1->nTravIds;
          }
          uVar4 = (ulong)pAVar3->pFanin1 & 0xfffffffffffffffe;
          uVar6 = (ulong)pAVar8->pFanin1 & 0xfffffffffffffffe;
          if ((*(int *)(uVar6 + 0x20) != iVar9) == (*(int *)(uVar4 + 0x20) == iVar7)) {
            __assert_fail("Aig_ObjIsTravIdCurrent(p0, pFanin0) == Aig_ObjIsTravIdCurrent(p1, pFanin1)"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saigWnd.c"
                          ,0x2b6,
                          "void Saig_ManWindowCreatePos(Aig_Man_t *, Aig_Man_t *, Aig_Man_t *)");
          }
          if (*(int *)(uVar4 + 0x20) == iVar7) goto LAB_005a62e6;
        }
      }
    }
    i = i + 1;
  } while( true );
}

Assistant:

void Saig_ManWindowCreatePos( Aig_Man_t * pNew, Aig_Man_t * p0, Aig_Man_t * p1 )
{
    Aig_Obj_t * pObj0, * pObj1, * pMiter;
    Aig_Obj_t * pFanin0, * pFanin1;
    int i;
    Aig_ManForEachObj( p0, pObj0, i )
    {
        if ( Aig_ObjIsTravIdCurrent(p0, pObj0) )
            continue;
        if ( Aig_ObjIsConst1(pObj0) )
            continue;
        if ( Aig_ObjIsCi(pObj0) )
            continue;
        pObj1 = Aig_ObjRepr( p0, pObj0 );
        assert( pObj0 == Aig_ObjRepr( p1, pObj1 ) );
        if ( Aig_ObjIsCo(pObj0) )
        {
            pFanin0 = Aig_ObjFanin0(pObj0);
            pFanin1 = Aig_ObjFanin0(pObj1);
            assert( Aig_ObjIsTravIdCurrent(p0, pFanin0) ==
                    Aig_ObjIsTravIdCurrent(p1, pFanin1) );
            if ( Aig_ObjIsTravIdCurrent(p0, pFanin0) )
            {
                pMiter = Aig_Exor( pNew, (Aig_Obj_t *)pFanin0->pData, (Aig_Obj_t *)pFanin1->pData );
                Aig_ObjCreateCo( pNew, pMiter );
            }
        }
        else
        {
            assert( Aig_ObjIsNode(pObj0) );

            pFanin0 = Aig_ObjFanin0(pObj0);
            pFanin1 = Aig_ObjFanin0(pObj1);
            assert( Aig_ObjIsTravIdCurrent(p0, pFanin0) ==
                    Aig_ObjIsTravIdCurrent(p1, pFanin1) );
            if ( Aig_ObjIsTravIdCurrent(p0, pFanin0) )
            {
                pMiter = Aig_Exor( pNew, (Aig_Obj_t *)pFanin0->pData, (Aig_Obj_t *)pFanin1->pData );
                Aig_ObjCreateCo( pNew, pMiter );
            }

            pFanin0 = Aig_ObjFanin1(pObj0);
            pFanin1 = Aig_ObjFanin1(pObj1);
            assert( Aig_ObjIsTravIdCurrent(p0, pFanin0) ==
                    Aig_ObjIsTravIdCurrent(p1, pFanin1) );
            if ( Aig_ObjIsTravIdCurrent(p0, pFanin0) )
            {
                pMiter = Aig_Exor( pNew, (Aig_Obj_t *)pFanin0->pData, (Aig_Obj_t *)pFanin1->pData );
                Aig_ObjCreateCo( pNew, pMiter );
            }
        }
    }
}